

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts-seq.c
# Opt level: O0

Result * parTreeSearch(Result *__return_storage_ptr__,int depth,Node *parent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 local_68 [8];
  Result c;
  Node child;
  int j;
  int i;
  counter_t parentHeight;
  int childType;
  int numChildren;
  Node *parent_local;
  int depth_local;
  
  iVar1 = parent->height;
  __return_storage_ptr__->maxdepth = (long)depth;
  __return_storage_ptr__->size = 1;
  __return_storage_ptr__->leaves = 0;
  iVar2 = uts_numChildren(parent);
  iVar3 = uts_childType(parent);
  parent->numChildren = iVar2;
  if (iVar2 < 1) {
    __return_storage_ptr__->leaves = 1;
  }
  else {
    child.state.state[0x10] = '\0';
    child.state.state[0x11] = '\0';
    child.state.state[0x12] = '\0';
    child.state.state[0x13] = '\0';
    for (; (int)child.state.state._16_4_ < iVar2;
        child.state.state._16_4_ = child.state.state._16_4_ + 1) {
      c.leaves._4_4_ = iVar1 + 1;
      child.type = -1;
      child.state.state[0xc] = '\0';
      child.state.state[0xd] = '\0';
      child.state.state[0xe] = '\0';
      child.state.state[0xf] = '\0';
      c.leaves._0_4_ = iVar3;
      for (; (int)child.state.state._12_4_ < computeGranularity;
          child.state.state._12_4_ = child.state.state._12_4_ + 1) {
        rng_spawn((parent->state).state,(RNG_state *)&child.height,child.state.state._16_4_);
      }
      parTreeSearch((Result *)local_68,depth + 1,(Node *)&c.leaves);
      if (__return_storage_ptr__->maxdepth < (ulong)local_68) {
        __return_storage_ptr__->maxdepth = (counter_t)local_68;
      }
      __return_storage_ptr__->size = c.maxdepth + __return_storage_ptr__->size;
      __return_storage_ptr__->leaves = c.size + __return_storage_ptr__->leaves;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result parTreeSearch(int depth, Node *parent) {
  int numChildren, childType;
  counter_t parentHeight = parent->height;

  Result r = { depth, 1, 0 };

  numChildren = uts_numChildren(parent);
  childType   = uts_childType(parent);

  // record number of children in parent
  parent->numChildren = numChildren;
  
  // Recurse on the children
  if (numChildren > 0) {
    int i, j;
    for (i = 0; i < numChildren; i++) {
      Node child;
      child.type = childType;
      child.height = parentHeight + 1;
      child.numChildren = -1;    // not yet determined
      for (j = 0; j < computeGranularity; j++) {
        rng_spawn(parent->state.state, child.state.state, i);
      }
      Result c = parTreeSearch(depth+1, &child);
      if (c.maxdepth>r.maxdepth) r.maxdepth = c.maxdepth;
      r.size += c.size;
      r.leaves += c.leaves;
    }
  } else {
    r.leaves = 1;
  }

  return r;
}